

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O2

void __thiscall
Imath_2_5::Box<Imath_2_5::Vec4<double>_>::extendBy
          (Box<Imath_2_5::Vec4<double>_> *this,Box<Imath_2_5::Vec4<double>_> *box)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  
  for (lVar3 = -0x20; lVar3 != 0; lVar3 = lVar3 + 8) {
    dVar2 = *(double *)((long)&(box->max).x + lVar3);
    if (dVar2 < *(double *)((long)&(this->max).x + lVar3)) {
      *(double *)((long)&(this->max).x + lVar3) = dVar2;
    }
    dVar2 = *(double *)((long)&box[1].min.x + lVar3);
    pdVar1 = (double *)((long)&this[1].min.x + lVar3);
    if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
      *(double *)((long)&this[1].min.x + lVar3) = dVar2;
    }
  }
  return;
}

Assistant:

inline void
Box<T>::extendBy(const Box<T> &box)
{
    for (unsigned int i = 0; i < min.dimensions(); i++)
    {
	if (box.min[i] < min[i])
	    min[i] = box.min[i];

	if (box.max[i] > max[i])
	    max[i] = box.max[i];
    }
}